

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

void ucnv_setToUCallBack_63
               (UConverter *converter,UConverterToUCallback newAction,void *newContext,
               UConverterToUCallback *oldAction,void **oldContext,UErrorCode *err)

{
  if (U_ZERO_ERROR < *err) {
    return;
  }
  if (oldAction != (UConverterToUCallback *)0x0) {
    *oldAction = converter->fromCharErrorBehaviour;
  }
  converter->fromCharErrorBehaviour = newAction;
  if (oldContext != (void **)0x0) {
    *oldContext = converter->toUContext;
  }
  converter->toUContext = newContext;
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }